

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv4Transmitter::Poll(RTPUDPv4Transmitter *this)

{
  int iVar1;
  
  iVar1 = -0x5a;
  if ((this->init == true) && (iVar1 = -0x59, this->created == true)) {
    iVar1 = PollSocket(this,true);
    if ((-1 < iVar1) && (this->rtpsock != this->rtcpsock)) {
      iVar1 = PollSocket(this,false);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::Poll()
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	int status;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	status = PollSocket(true); // poll RTP socket
	if (rtpsock != rtcpsock) // no need to poll twice when multiplexing
	{
		if (status >= 0)
			status = PollSocket(false); // poll RTCP socket
	}
	MAINMUTEX_UNLOCK
	return status;
}